

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O2

void ptm_mgau_reset_fast_hist(ps_mgau_t *ps)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  _func_int_ps_mgau_t_ptr_int16_ptr_uint8_ptr_int32_mfcc_t_ptr_ptr_int32_int32 *__s;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  long lVar12;
  
  for (lVar12 = 0; lVar12 < *(int *)&ps[6].vt; lVar12 = lVar12 + 1) {
    pcVar5 = (char *)__ckd_calloc_3d__((long)*(int *)(*(long *)&ps[1].frame_idx + 0x20),
                                       (long)*(int *)(*(long *)&ps[1].frame_idx + 0x24),
                                       (long)(short)ps[4].frame_idx,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                       ,0x30b);
    (&(ps[5].vt)->name)[lVar12 * 2] = pcVar5;
    lVar3 = *(long *)&ps[1].frame_idx;
    uVar1 = *(uint *)(lVar3 + 0x20);
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      uVar2 = *(uint *)(lVar3 + 0x24);
      uVar8 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar8 = 0;
      }
      for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
        uVar10 = (ushort)ps[4].frame_idx;
        if ((short)uVar10 < 1) {
          uVar10 = 0;
        }
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          lVar4 = *(long *)(*(long *)(pcVar5 + uVar7 * 8) + uVar9 * 8);
          *(int *)(lVar4 + uVar11 * 8) = (int)uVar11;
          *(undefined4 *)(lVar4 + 4 + uVar11 * 8) = 0x80000000;
        }
      }
    }
    __s = (_func_int_ps_mgau_t_ptr_int16_ptr_uint8_ptr_int32_mfcc_t_ptr_ptr_int32_int32 *)
          __ckd_calloc__((long)((int)(uVar1 + 0x1f) / 0x20),4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                         ,0x317);
    (&(ps[5].vt)->frame_eval)[lVar12 * 2] = __s;
    memset(__s,0xff,(long)((*(int *)(*(long *)&ps[1].frame_idx + 0x20) + 0x1f) / 0x20) << 2);
  }
  return;
}

Assistant:

void
ptm_mgau_reset_fast_hist(ps_mgau_t *ps)
{
    ptm_mgau_t *s = (ptm_mgau_t *)ps;
    int i;

    for (i = 0; i < s->n_fast_hist; ++i) {
        int j, k, m;
        /* Top-N codewords for every codebook and feature. */
        s->hist[i].topn = ckd_calloc_3d(s->g->n_mgau, s->g->n_feat,
                                        s->max_topn, sizeof(ptm_topn_t));
        /* Initialize them to sane (yet arbitrary) defaults. */
        for (j = 0; j < s->g->n_mgau; ++j) {
            for (k = 0; k < s->g->n_feat; ++k) {
                for (m = 0; m < s->max_topn; ++m) {
                    s->hist[i].topn[j][k][m].cw = m;
                    s->hist[i].topn[j][k][m].score = WORST_DIST;
                }
            }
        }
        /* Active codebook mapping (just codebook, not features,
           at least not yet) */
        s->hist[i].mgau_active = bitvec_alloc(s->g->n_mgau);
        /* Start with them all on, prune them later. */
        bitvec_set_all(s->hist[i].mgau_active, s->g->n_mgau);
    }
}